

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O3

int32_t __thiscall
icu_63::UCharsTrieBuilder::indexOfElementWithNextUnit
          (UCharsTrieBuilder *this,int32_t i,int32_t unitIndex,UChar unit)

{
  short sVar1;
  int iVar2;
  UCharsTrieElement *pUVar3;
  UChar UVar4;
  uint uVar5;
  char16_t *pcVar6;
  uint uVar7;
  
  sVar1 = (this->strings).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar5 = (this->strings).fUnion.fFields.fLength;
  }
  else {
    uVar5 = (int)sVar1 >> 5;
  }
  if (((int)sVar1 & 2U) == 0) {
    pcVar6 = (this->strings).fUnion.fFields.fArray;
  }
  else {
    pcVar6 = (char16_t *)((long)&(this->strings).fUnion + 2);
  }
  iVar2 = i + -1;
  pUVar3 = this->elements + i;
  do {
    uVar7 = pUVar3->stringOffset + unitIndex + 1;
    UVar4 = L'\xffff';
    if (uVar7 < uVar5) {
      UVar4 = pcVar6[(int)uVar7];
    }
    iVar2 = iVar2 + 1;
    pUVar3 = pUVar3 + 1;
  } while (UVar4 == unit);
  return iVar2;
}

Assistant:

int32_t
UCharsTrieBuilder::indexOfElementWithNextUnit(int32_t i, int32_t unitIndex, UChar unit) const {
    while(unit==elements[i].charAt(unitIndex, strings)) {
        ++i;
    }
    return i;
}